

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_3::ArgContext::Bind
          (ArgContext *this,UnboundConversion *unbound,BoundConversion *bound)

{
  byte bVar1;
  pointer pFVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  undefined8 in_RAX;
  pointer pFVar7;
  void *pvVar8;
  undefined4 uVar9;
  Data *pDVar10;
  int *next_arg;
  long extraout_RDX;
  code *pcVar12;
  undefined8 extraout_RDX_00;
  size_t extraout_RDX_01;
  code *extraout_RDX_03;
  char *pcVar13;
  undefined8 unaff_RBP;
  Data DVar14;
  ulong in_R8;
  pointer pFVar15;
  UnboundConversion *end;
  char *pcVar16;
  char *pcVar17;
  UnboundConversion *pUVar18;
  string_view conv_string;
  string_view conv_string_00;
  string_view conv_string_01;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  int width;
  int precision;
  int iStack_4dc;
  Data DStack_4d8;
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  CStack_4d0;
  UnboundConversion UStack_4b8;
  undefined1 *puStack_4a8;
  long lStack_4a0;
  undefined1 uStack_498;
  undefined7 uStack_497;
  long lStack_490;
  FormatSinkImpl FStack_488;
  BoundConversion *pBStack_68;
  pointer pFStack_60;
  pointer pFStack_58;
  UnboundConversion *pUStack_50;
  ArgContext *pAStack_48;
  code *pcStack_40;
  Data local_38;
  pointer pFVar11;
  code *extraout_RDX_02;
  
  pDVar10 = &local_38;
  pFVar15 = (pointer)((long)unbound->arg_position + -1);
  pFVar11 = (pointer)(this->pack_).len_;
  if (pFVar11 <= pFVar15) {
    return false;
  }
  pFVar2 = (this->pack_).ptr_;
  if (unbound->flags == kBasic) {
    (bound->super_FormatConversionSpecImpl).flags_ = kBasic;
    (bound->super_FormatConversionSpecImpl).width_ = -1;
    (bound->super_FormatConversionSpecImpl).precision_ = -1;
    goto LAB_004c0d3f;
  }
  local_38._0_4_ = (unbound->width).value_;
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  pUVar18 = unbound;
  DVar14 = (Data)this;
  if (-2 < (int)local_38._0_4_) {
LAB_004c0cc6:
    unaff_RBP = 0;
LAB_004c0cc8:
    local_38._4_4_ = (unbound->precision).value_;
    if ((int)local_38._4_4_ < -1) {
      uVar3 = (this->pack_).len_;
      if (uVar3 < (uint)~local_38._4_4_) {
        return false;
      }
      in_R8 = (ulong)(uint)~local_38._4_4_ - 1;
      if (uVar3 <= in_R8) goto LAB_004c0d82;
      pFVar11 = (this->pack_).ptr_;
      pcStack_40 = (code *)0x4c0d0b;
      bVar6 = (*pFVar11[in_R8].dispatcher_)
                        (pFVar11[in_R8].data_,(FormatConversionSpecImpl)ZEXT812(0x90013),
                         local_38.buf + 4);
      if (!bVar6) {
        return false;
      }
    }
    (bound->super_FormatConversionSpecImpl).width_ = local_38._0_4_;
    (bound->super_FormatConversionSpecImpl).precision_ = local_38._4_4_;
    (bound->super_FormatConversionSpecImpl).flags_ = (Flags)unaff_RBP | unbound->flags;
    (bound->super_FormatConversionSpecImpl).length_mod_ = unbound->length_mod;
LAB_004c0d3f:
    (bound->super_FormatConversionSpecImpl).conv_ = unbound->conv;
    bound->arg_ = pFVar2 + (long)pFVar15;
    return true;
  }
  if (pFVar11 < (pointer)(ulong)(uint)~local_38._0_4_) {
    return false;
  }
  pFVar7 = (pointer)((long)&((pointer)(ulong)(uint)~local_38._0_4_)[-1].dispatcher_ + 7);
  if (pFVar7 < pFVar11) {
    DVar14 = pFVar2[(long)pFVar7].data_;
    pcStack_40 = (code *)0x4c0cb7;
    pUVar18 = (UnboundConversion *)0x90013;
    bVar6 = (*pFVar2[(long)pFVar7].dispatcher_)
                      (DVar14,(FormatConversionSpecImpl)ZEXT812(0x90013),&local_38);
    if (!bVar6) {
      return false;
    }
    pFVar11 = (pointer)pDVar10;
    if (-1 < (int)local_38._0_4_) goto LAB_004c0cc6;
    uVar9 = 0x80000001;
    if (0x80000001 < (uint)local_38._0_4_) {
      uVar9 = local_38._0_4_;
    }
    local_38._0_4_ = -uVar9;
    pFVar11 = (pointer)(ulong)(uint)local_38._0_4_;
    unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    goto LAB_004c0cc8;
  }
  pcStack_40 = (code *)0x4c0d82;
  _GLOBAL__N_1::ArgContext::Bind();
LAB_004c0d82:
  pcStack_40 = Summarize_abi_cxx11_;
  _GLOBAL__N_1::ArgContext::Bind();
  puStack_4a8 = &uStack_498;
  lStack_4a0 = 0;
  uStack_498 = 0;
  FStack_488.raw_.sink_ = &puStack_4a8;
  FStack_488.pos_ = FStack_488.buf_;
  pcVar12 = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  FStack_488.raw_.write_ = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  FStack_488.size_ = 0;
  CStack_4d0.converter_.sink_ = &FStack_488;
  DStack_4d8 = DVar14;
  CStack_4d0.arg_context_.pack_.ptr_ = pFVar11;
  CStack_4d0.arg_context_.pack_.len_ = in_R8;
  pBStack_68 = bound;
  pFStack_60 = pFVar15;
  pFStack_58 = pFVar2;
  pUStack_50 = unbound;
  pAStack_48 = this;
  pcStack_40 = (code *)unaff_RBP;
  if (extraout_RDX == -1) {
    pcVar13 = *(char **)(pUVar18 + 1);
    pcVar4 = *(char **)&pUVar18[1].precision;
    if (pcVar13 != pcVar4) {
      pcVar5 = *(char **)&pUVar18->precision;
      pcVar17 = (char *)0x0;
      pcVar16 = pcVar5;
      do {
        pcVar16 = pcVar16 + (long)pcVar17;
        pcVar17 = pcVar5 + (*(long *)(pcVar13 + 8) - (long)pcVar16);
        if (*pcVar13 == '\x01') {
          conv_string_01._M_str = (char *)pFVar11;
          conv_string_01._M_len = (size_t)pcVar12;
          bVar6 = ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                  ::ConvertOne(&CStack_4d0,(UnboundConversion *)(pcVar13 + 0x10),conv_string_01);
          pcVar12 = extraout_RDX_02;
          if (!bVar6) goto LAB_004c0f7b;
        }
        else {
          v_01._M_str = pcVar16;
          v_01._M_len = (size_t)pcVar17;
          FormatSinkImpl::Append(&FStack_488,v_01);
          pcVar12 = extraout_RDX_03;
        }
        pcVar13 = pcVar13 + 0x20;
      } while (pcVar13 != pcVar4);
    }
    if ((char)pUVar18->arg_position != '\0') {
LAB_004c0f7b:
      *(long *)DStack_4d8.ptr = (long)DStack_4d8.ptr + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)DStack_4d8.ptr,"");
      FormatSinkImpl::~FormatSinkImpl(&FStack_488);
      if (puStack_4a8 != &uStack_498) {
        operator_delete(puStack_4a8,CONCAT71(uStack_497,uStack_498) + 1);
      }
      goto LAB_004c101a;
    }
  }
  else {
    iStack_4dc = 0;
    if (extraout_RDX != 0) {
      end = (UnboundConversion *)((long)&pUVar18->arg_position + extraout_RDX);
      do {
        pvVar8 = memchr(pUVar18,0x25,(long)end - (long)pUVar18);
        if (pvVar8 == (void *)0x0) {
          v_02._M_str = (char *)pUVar18;
          v_02._M_len = (long)end - (long)pUVar18;
          FormatSinkImpl::Append(CStack_4d0.converter_.sink_,v_02);
          break;
        }
        v._M_len = (long)pvVar8 - (long)pUVar18;
        v._M_str = (char *)pUVar18;
        FormatSinkImpl::Append(CStack_4d0.converter_.sink_,v);
        pUVar18 = (UnboundConversion *)((long)pvVar8 + 1);
        if (end <= pUVar18) goto LAB_004c0f7b;
        bVar1 = (byte)pUVar18->arg_position;
        if ((char)ConvTagHolder::value[bVar1].tag_ < '\0') {
          if (bVar1 == 0x25) {
            v_00._M_str = "%";
            v_00._M_len = 1;
            FormatSinkImpl::Append(CStack_4d0.converter_.sink_,v_00);
            goto LAB_004c0ebb;
          }
          UStack_4b8.width.value_ = -1;
          UStack_4b8.precision.value_ = -1;
          UStack_4b8.flags = kBasic;
          UStack_4b8.length_mod = none;
          UStack_4b8.conv = v|s;
          next_arg = &iStack_4dc;
          pUVar18 = (UnboundConversion *)
                    ConsumeUnboundConversionNoInline
                              ((char *)pUVar18,(char *)end,&UStack_4b8,next_arg);
          if ((pUVar18 == (UnboundConversion *)0x0) ||
             (conv_string_00._M_str = (char *)next_arg, conv_string_00._M_len = extraout_RDX_01,
             bVar6 = ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                     ::ConvertOne(&CStack_4d0,&UStack_4b8,conv_string_00), !bVar6))
          goto LAB_004c0f7b;
        }
        else {
          if (iStack_4dc < 0) goto LAB_004c0f7b;
          UStack_4b8.width.value_ = -1;
          UStack_4b8.precision.value_ = -1;
          UStack_4b8.flags = kBasic;
          UStack_4b8.length_mod = none;
          conv_string._M_str._0_4_ = iStack_4dc + 1;
          conv_string._M_len = extraout_RDX_00;
          conv_string._M_str._4_4_ = 0;
          iStack_4dc = (int)conv_string._M_str;
          UStack_4b8.arg_position = (int)conv_string._M_str;
          UStack_4b8.conv = ConvTagHolder::value[bVar1].tag_;
          bVar6 = ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                  ::ConvertOne(&CStack_4d0,&UStack_4b8,conv_string);
          if (!bVar6) goto LAB_004c0f7b;
LAB_004c0ebb:
          pUVar18 = (UnboundConversion *)((long)pvVar8 + 2);
        }
      } while (pUVar18 != end);
    }
  }
  FormatSinkImpl::~FormatSinkImpl(&FStack_488);
  *(long **)DStack_4d8.ptr = (long *)((long)DStack_4d8.ptr + 0x10);
  if (puStack_4a8 == &uStack_498) {
    *(long *)((long)DStack_4d8.ptr + 0x10) = CONCAT71(uStack_497,uStack_498);
    *(long *)((long)DStack_4d8.ptr + 0x18) = lStack_490;
  }
  else {
    *(undefined1 **)DStack_4d8.ptr = puStack_4a8;
    *(long *)((long)DStack_4d8.ptr + 0x10) = CONCAT71(uStack_497,uStack_498);
  }
  *(long *)((long)DStack_4d8.ptr + 8) = lStack_4a0;
LAB_004c101a:
  return DStack_4d8.buf[0];
}

Assistant:

inline bool ArgContext::Bind(const UnboundConversion* unbound,
                             BoundConversion* bound) {
  const FormatArgImpl* arg = nullptr;
  int arg_position = unbound->arg_position;
  if (static_cast<size_t>(arg_position - 1) >= pack_.size()) return false;
  arg = &pack_[static_cast<size_t>(arg_position - 1)];  // 1-based

  if (unbound->flags != Flags::kBasic) {
    int width = unbound->width.value();
    bool force_left = false;
    if (unbound->width.is_from_arg()) {
      if (!BindFromPosition(unbound->width.get_from_arg(), &width, pack_))
        return false;
      if (width < 0) {
        // "A negative field width is taken as a '-' flag followed by a
        // positive field width."
        force_left = true;
        // Make sure we don't overflow the width when negating it.
        width = -std::max(width, -std::numeric_limits<int>::max());
      }
    }

    int precision = unbound->precision.value();
    if (unbound->precision.is_from_arg()) {
      if (!BindFromPosition(unbound->precision.get_from_arg(), &precision,
                            pack_))
        return false;
    }

    FormatConversionSpecImplFriend::SetWidth(width, bound);
    FormatConversionSpecImplFriend::SetPrecision(precision, bound);

    if (force_left) {
      FormatConversionSpecImplFriend::SetFlags(unbound->flags | Flags::kLeft,
                                               bound);
    } else {
      FormatConversionSpecImplFriend::SetFlags(unbound->flags, bound);
    }

    FormatConversionSpecImplFriend::SetLengthMod(unbound->length_mod, bound);
  } else {
    FormatConversionSpecImplFriend::SetFlags(unbound->flags, bound);
    FormatConversionSpecImplFriend::SetWidth(-1, bound);
    FormatConversionSpecImplFriend::SetPrecision(-1, bound);
  }
  FormatConversionSpecImplFriend::SetConversionChar(unbound->conv, bound);
  bound->set_arg(arg);
  return true;
}